

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c6280_mame.c
# Opt level: O0

void c6280mame_w(void *chip,UINT8 offset,UINT8 data)

{
  ushort *puVar1;
  t_channel *chan;
  c6280_t *p;
  UINT8 data_local;
  UINT8 offset_local;
  void *chip_local;
  
  puVar1 = (ushort *)((long)chip + (ulong)*(byte *)((long)chip + 8) * 0x3c + 0xc);
  switch(offset & 0xf) {
  case 0:
    *(byte *)((long)chip + 8) = data & 7;
    break;
  case 1:
    *(UINT8 *)((long)chip + 9) = data;
    break;
  case 2:
    *puVar1 = *puVar1 & 0xf00 | (ushort)data;
    *puVar1 = *puVar1 & 0xfff;
    break;
  case 3:
    *puVar1 = *puVar1 & 0xff | (ushort)data << 8;
    *puVar1 = *puVar1 & 0xfff;
    break;
  case 4:
    if (((puVar1[1] & 0x40) != 0) && ((data & 0x40) == 0)) {
      *(undefined1 *)(puVar1 + 0x12) = 0;
    }
    if (((puVar1[1] & 0x80) == 0) && ((data & 0x80) != 0)) {
      puVar1[0x1a] = 0;
      puVar1[0x1b] = 0;
    }
    *(UINT8 *)(puVar1 + 1) = data;
    break;
  case 5:
    *(UINT8 *)((long)puVar1 + 3) = data;
    break;
  case 6:
    if ((puVar1[1] & 0x40) == 0) {
      *(byte *)((long)puVar1 + (long)(int)((byte)puVar1[0x12] & 0x1f) + 4) = data & 0x1f;
      if ((puVar1[1] & 0x80) == 0) {
        *(byte *)(puVar1 + 0x12) = (char)puVar1[0x12] + 1U & 0x1f;
      }
    }
    else if ((puVar1[1] & 0x40) == 0x40) {
      puVar1[0x13] = data & 0x1f;
    }
    break;
  case 7:
    *(UINT8 *)(puVar1 + 0x14) = data;
    break;
  case 8:
    *(UINT8 *)((long)chip + 10) = data;
    break;
  case 9:
    *(UINT8 *)((long)chip + 0xb) = data;
  }
  return;
}

Assistant:

static void c6280mame_w(void *chip, UINT8 offset, UINT8 data)
{
	c6280_t *p = (c6280_t *)chip;
	t_channel *chan = &p->channel[p->select];

	//m_cpudevice->io_set_buffer(data);

	switch(offset & 0x0F)
	{
		case 0x00: /* Channel select */
			p->select = data & 0x07;
			break;

		case 0x01: /* Global balance */
			p->balance  = data;
			break;

		case 0x02: /* Channel frequency (LSB) */
			chan->frequency = (chan->frequency & 0x0F00) | data;
			chan->frequency &= 0x0FFF;
			break;

		case 0x03: /* Channel frequency (MSB) */
			chan->frequency = (chan->frequency & 0x00FF) | (data << 8);
			chan->frequency &= 0x0FFF;
			break;

		case 0x04: /* Channel control (key-on, DDA mode, volume) */

			/* 1-to-0 transition of DDA bit resets waveform index */
			if ((chan->control & 0x40) && ((data & 0x40) == 0))
			{
				chan->index = 0;
			}
			if (((chan->control & 0x80) == 0) && (data & 0x80))
			{
				chan->counter = 0;
			}
			chan->control = data;
			break;

		case 0x05: /* Channel balance */
			chan->balance = data;
			break;

		case 0x06: /* Channel waveform data */

			switch(chan->control & 0x40)
			{
				case 0x00: /* Waveform */
					chan->waveform[chan->index & 0x1F] = data & 0x1F;
					if (!(chan->control & 0x80)) // TODO : wave pointer is increased at writing data when sound playback is off??
						chan->index = (chan->index + 1) & 0x1F;
					break;

				case 0x40: /* Direct D/A */
					chan->dda = data & 0x1F;
					break;
			}

			break;

		case 0x07: /* Noise control (enable, frequency) */
			chan->noise_control = data;
			break;

		case 0x08: /* LFO frequency */
			p->lfo_frequency = data;
			break;

		case 0x09: /* LFO control (enable, mode) */
			p->lfo_control = data;
			break;

		default:
			break;
	}
}